

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

void Abc_SclPrintBufferTrees(SC_Man *p,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  int iVar1;
  long lVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar2 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar4->pArray[lVar2];
      if ((pObj != (Abc_Obj_t *)0x0) &&
         (((*(uint *)&pObj->field_0x14 & 0xf) != 7 || ((pObj->vFanins).nSize != 1)))) {
        iVar1 = Abc_SclCountBufferFanoutsInt(pObj);
        if (3 < iVar1) {
          Abc_SclPrintBuffersOne(p,pObj,0);
          iVar1 = (pObj->vFanouts).nSize;
          if (0 < iVar1) {
            lVar3 = 0;
            do {
              pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]];
              if (((*(uint *)&pObj_00->field_0x14 & 0xf) == 7) && ((pObj_00->vFanins).nSize == 1)) {
                Abc_SclPrintBuffersInt(p,pObj_00,1);
                iVar1 = (pObj->vFanouts).nSize;
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < iVar1);
          }
          putchar(10);
          pVVar4 = pNtk->vObjs;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_SclPrintBufferTrees( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsBuffer(pObj) && Abc_SclCountBufferFanouts(pObj) > 3 )
        {           
            Abc_SclPrintBuffersOne( p, pObj, 0 );
            Abc_ObjForEachFanout( pObj, pFanout, k )
                if ( Abc_ObjIsBuffer(pFanout) )
                    Abc_SclPrintBuffersInt( p, pFanout, 1 );
            printf( "\n" );
        }
    }
}